

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O2

void computeAuxTape(randomTape_t *tapes,uint8_t *input_masks,picnic_instance_t *params)

{
  byte bVar1;
  size_t i;
  ulong uVar2;
  ulong uVar3;
  mzd_local_t lowmc_key [1];
  mzd_local_t local_80 [2];
  
  local_80[0].w64[0] = 0;
  local_80[0].w64[1] = 0;
  local_80[0].w64[2] = 0;
  local_80[0].w64[3] = 0;
  bVar1 = params->view_size;
  for (uVar2 = 0; uVar2 < params->num_MPC_parties; uVar2 = uVar2 + 1) {
    for (uVar3 = 0; (uint)bVar1 * 2 != uVar3; uVar3 = uVar3 + 1) {
      tapes->parity_tapes[uVar3] = tapes->parity_tapes[uVar3] ^ tapes->tape[uVar2][uVar3];
    }
  }
  mzd_from_char_array(local_80,tapes->parity_tapes,(ulong)params->input_output_size);
  tapes->pos = (uint)(params->lowmc).n;
  tapes->aux_pos = 0;
  memset(tapes->aux_bits,0,(ulong)params->view_size);
  lowmc_compute_aux(&params->lowmc,local_80,tapes);
  if (input_masks != (uint8_t *)0x0) {
    mzd_to_char_array(input_masks,local_80,(ulong)params->input_output_size);
  }
  tapes->pos = 0;
  return;
}

Assistant:

static void computeAuxTape(randomTape_t* tapes, uint8_t* input_masks,
                           const picnic_instance_t* params) {
  mzd_local_t lowmc_key[1] = {0};

  size_t tapeSizeBytes = 2 * params->view_size;

  // combine into key shares and calculate lowmc evaluation in plain
  for (size_t i = 0; i < params->num_MPC_parties; i++) {
    for (size_t j = 0; j < tapeSizeBytes; j++) {
      tapes->parity_tapes[j] ^= tapes->tape[i][j];
    }
  }
  mzd_from_char_array(lowmc_key, tapes->parity_tapes, params->input_output_size);
  tapes->pos     = params->lowmc.n;
  tapes->aux_pos = 0;
  memset(tapes->aux_bits, 0, params->view_size);

  // Perform LowMC evaluation and fix AND masks for all AND gates
  lowmc_compute_aux(&params->lowmc, lowmc_key, tapes);

  // write the key masks to the input
  if (input_masks != NULL) {
    mzd_to_char_array(input_masks, lowmc_key, params->input_output_size);
  }

  // Reset the random tape counter so that the online execution uses the
  // same random bits as when computing the aux shares
  tapes->pos = 0;
}